

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

void BackwardReferences2DLocality(int xsize,VP8LBackwardRefs *refs)

{
  int iVar1;
  PixOrCopyBlock *pPVar2;
  PixOrCopyBlock **ppPVar3;
  
  if ((refs != (VP8LBackwardRefs *)0x0) && (pPVar2 = refs->refs, pPVar2 != (PixOrCopyBlock *)0x0)) {
    ppPVar3 = &pPVar2->next + *(int *)&refs->tail;
    do {
      if (*(char *)&pPVar2->next == '\x02') {
        iVar1 = VP8LDistanceToPlaneCode(xsize,*(int *)((long)&pPVar2->next + 4));
        *(int *)((long)&pPVar2->next + 4) = iVar1;
      }
      pPVar2 = (PixOrCopyBlock *)&pPVar2->start;
      if (pPVar2 == (PixOrCopyBlock *)ppPVar3) {
        refs = *(VP8LBackwardRefs **)refs;
        if (refs == (VP8LBackwardRefs *)0x0) {
          return;
        }
        pPVar2 = refs->refs;
        ppPVar3 = &pPVar2->next + *(int *)&refs->tail;
      }
    } while (pPVar2 != (PixOrCopyBlock *)0x0);
  }
  return;
}

Assistant:

static void BackwardReferences2DLocality(int xsize,
                                         const VP8LBackwardRefs* const refs) {
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  while (VP8LRefsCursorOk(&c)) {
    if (PixOrCopyIsCopy(c.cur_pos)) {
      const int dist = c.cur_pos->argb_or_distance;
      const int transformed_dist = VP8LDistanceToPlaneCode(xsize, dist);
      c.cur_pos->argb_or_distance = transformed_dist;
    }
    VP8LRefsCursorNext(&c);
  }
}